

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O2

void __thiscall Am_Point_List::Am_Point_List(Am_Point_List *this,Am_Value *in_value)

{
  uint *puVar1;
  Am_Point_List_Data *pAVar2;
  
  pAVar2 = (Am_Point_List_Data *)(in_value->value).wrapper_value;
  this->data = pAVar2;
  this->item = (Am_Point_Item *)0x0;
  if (pAVar2 != (Am_Point_List_Data *)0x0) {
    if (Am_Point_List_Data::id != in_value->type) {
      Am_Error("** Tried to set a Am_Point_List with a non Am_Point_List wrapper.");
    }
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

Am_Point_List::Am_Point_List(const Am_Value &in_value)
{
  data = (Am_Point_List_Data *)in_value.value.wrapper_value;
  item = nullptr;
  if (data) {
    if (Am_Point_List_Data::Am_Point_List_Data_ID() != in_value.type)
      Am_Error("** Tried to set a Am_Point_List with a non "
               "Am_Point_List wrapper.");
    data->Note_Reference();
  }
}